

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::processPriorityCommand(CoreBroker *this,ActionMessage *command)

{
  BrokerBase *this_00;
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  *this_01;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *this_02;
  ushort uVar1;
  GlobalFederateId GVar2;
  action_t aVar3;
  BaseType BVar4;
  pointer pcVar5;
  size_type sVar6;
  pointer __n;
  byte *__s1;
  pointer pcVar7;
  pointer pAVar8;
  pointer pBVar9;
  TimeoutMonitor *this_03;
  pointer pBVar10;
  uint uVar11;
  string_view message;
  string_view message_00;
  string_view message_01;
  int iVar12;
  route_id rVar13;
  BasicBrokerInfo *brk;
  iterator iVar14;
  BasicBrokerInfo *pBVar15;
  pointer pBVar16;
  ActionMessage *in_RDX;
  uint uVar17;
  uint uVar18;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __rlen;
  iterator __begin4;
  pointer pAVar19;
  pointer this_04;
  pointer pBVar20;
  string_view searchValue1;
  string_view searchValue1_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view fmt;
  string_view existingValue;
  string_view existingValue_00;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  route_id route_1;
  route_id route;
  string local_168;
  ActionMessage *local_140;
  undefined8 local_138;
  char *pcStack_130;
  byte *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_120;
  size_t local_118;
  char *pcStack_110;
  string local_108;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [10];
  
  this_00 = &this->super_BrokerBase;
  if (0x17 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
    GVar2.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    pcVar5 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    sVar6 = (this->super_BrokerBase).identifier._M_string_length;
    prettyPrintString_abi_cxx11_(&local_108,(helics *)command,in_RDX);
    local_d8[0]._0_4_ = (command->source_id).gid;
    local_e8._0_8_ = local_108._M_dataplus._M_p;
    local_e8._8_8_ = local_108._M_string_length;
    fmt.size_ = 0x1d;
    fmt.data_ = (char *)0x1a;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_e8;
    local_140 = command;
    ::fmt::v11::vformat_abi_cxx11_(&local_168,(v11 *)"|| priority_cmd:{} from {}",fmt,args);
    local_118 = local_168._M_string_length;
    pcStack_110 = local_168._M_dataplus._M_p;
    in_R9.values_ = (value<fmt::v11::context> *)0x0;
    message._M_str = local_168._M_dataplus._M_p;
    message._M_len = local_168._M_string_length;
    name._M_str = pcVar5;
    name._M_len = sVar6;
    BrokerBase::sendToLogger(this_00,GVar2,0x18,name,message,false);
    command = local_140;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  aVar3 = command->messageAction;
  if (aVar3 < cmd_send_command) {
    if (aVar3 < cmd_query_reply) {
      if (aVar3 != cmd_set_global) {
        if (aVar3 != cmd_reg_broker) {
          return;
        }
        brokerRegistration(this,command);
        return;
      }
    }
    else if (1 < (uint)(aVar3 + ~(cmd_reg_broker|cmd_tick))) {
      if (aVar3 != cmd_ping_priority) {
        if (aVar3 != cmd_reg_fed) {
          return;
        }
        fedRegistration(this,command);
        return;
      }
      if ((command->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
        routeMessage(this,command);
        return;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_ping_reply);
      local_d8[0]._0_4_ = (command->source_id).gid;
      local_e8._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
      routeMessage(this,(ActionMessage *)local_e8);
      goto LAB_002f1d23;
    }
  }
  else {
    if ((cmd_add_route|cmd_disconnect_fed) < aVar3) {
      if (aVar3 == cmd_fed_ack) {
        this_02 = &this->mFederates;
        local_e8._0_8_ = (command->payload).bufferSize;
        local_e8._8_8_ = (command->payload).heap;
        iVar14 = std::
                 _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&(this->mFederates).lookup1,(key_type *)local_e8);
        if (iVar14.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          pBVar20 = (this->mFederates).dataStorage.
                    super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          pBVar20 = (this_02->dataStorage).
                    super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start +
                    *(long *)((long)iVar14.
                                    super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x18);
        }
        if (pBVar20 ==
            (this->mFederates).dataStorage.
            super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_e8._0_8_ = (command->payload).bufferSize;
          local_e8._8_8_ = (command->payload).heap;
          searchValue1._M_str = (char *)local_e8._8_8_;
          searchValue1._M_len = local_e8._0_8_;
          gmlc::containers::
          DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
          ::insert<std::basic_string_view<char,std::char_traits<char>>>
                    ((DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
                      *)this_02,searchValue1,&command->dest_id,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_e8);
          rVar13 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
          pBVar9 = (this->mFederates).dataStorage.
                   super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pBVar9[-1].route.rid = rVar13.rid;
          pBVar9[-1].global_id.gid = (command->dest_id).gid;
          std::
          _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<helics::GlobalFederateId&,helics::route_id&>
                    ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->routing_table,&pBVar20->global_id,&pBVar9[-1].route);
          return;
        }
        local_168._M_dataplus._M_p._0_4_ = (pBVar20->route).rid;
        iVar12 = (pBVar20->global_id).gid;
        if ((iVar12 == -1700000000) || (iVar12 == -2010000000)) {
          (pBVar20->global_id).gid = (command->dest_id).gid;
          existingValue._M_str = (pBVar20->name)._M_dataplus._M_p;
          existingValue._M_len = (pBVar20->name)._M_string_length;
          gmlc::containers::
          DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
          ::addSearchTerm(this_02,&command->dest_id,existingValue);
        }
        (*(this->super_Broker)._vptr_Broker[0x22])
                  (this,(ulong)local_168._M_dataplus._M_p & 0xffffffff,command);
        std::
        _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<helics::GlobalFederateId&,helics::route_id&>
                  ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->routing_table,&pBVar20->global_id,&local_168);
        if ((this->super_BrokerBase).enable_profiling != true) {
          return;
        }
        ActionMessage::ActionMessage
                  ((ActionMessage *)local_e8,cmd_set_profiler_flag,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(command->dest_id).gid);
        local_d8[0]._10_1_ = local_d8[0]._M_local_buf[10] | 0x20;
        (*(this->super_Broker)._vptr_Broker[0x22])
                  (this,(ulong)local_168._M_dataplus._M_p & 0xffffffff,(ActionMessage *)local_e8);
      }
      else {
        if (aVar3 != cmd_priority_disconnect) {
          if (aVar3 != cmd_broker_setup) {
            return;
          }
          (this->super_BrokerBase).global_broker_id_local.gid =
               (this->super_BrokerBase).global_id._M_i.gid;
          (this->super_BrokerBase).field_0x294 = (this->super_BrokerBase).field_0x293 & 1;
          (((this->super_BrokerBase).timeCoord._M_t.
            super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
            .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->mSourceId).
          gid = (this->super_BrokerBase).global_broker_id_local.gid;
          (this->super_BrokerBase).field_0x295 = 1;
          pAVar19 = (this->earlyMessages).
                    super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pAVar8 = (this->earlyMessages).
                   super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pAVar19 == pAVar8) {
            return;
          }
          do {
            (*(this->super_Broker)._vptr_Broker
              [(ulong)((uint)pAVar19->messageAction >> 0x1f) + 0x1d])(this,pAVar19);
            pAVar19 = pAVar19 + 1;
          } while (pAVar19 != pAVar8);
          pAVar19 = (this->earlyMessages).
                    super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pAVar8 = (this->earlyMessages).
                   super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          this_04 = pAVar19;
          if (pAVar8 == pAVar19) {
            return;
          }
          do {
            ActionMessage::~ActionMessage(this_04);
            this_04 = this_04 + 1;
          } while (this_04 != pAVar8);
          (this->earlyMessages).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_finish = pAVar19;
          return;
        }
        pBVar15 = getBrokerById(this,(GlobalBrokerId)(command->source_id).gid);
        if (pBVar15 != (BasicBrokerInfo *)0x0) {
          pBVar15->state = DISCONNECTED;
        }
        pBVar16 = (this->mBrokers).dataStorage.
                  super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar10 = (this->mBrokers).dataStorage.
                  super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pBVar16 == pBVar10) {
          return;
        }
        iVar12 = 0;
        uVar17 = 0x32;
        do {
          uVar11._0_1_ = pBVar16->state;
          uVar11._1_1_ = pBVar16->_hasTimeDependency;
          uVar11._2_1_ = pBVar16->_core;
          uVar11._3_1_ = pBVar16->_nonLocal;
          uVar18 = uVar17 & 0xff;
          if ((byte)uVar17 <= (byte)(undefined1)uVar11) {
            uVar11 = uVar18;
          }
          iVar12 = iVar12 + (pBVar16->_nonLocal ^ 1);
          uVar17 = uVar11;
          if (pBVar16->_nonLocal != 0) {
            uVar17 = uVar18;
          }
          pBVar16 = pBVar16 + 1;
        } while (pBVar16 != pBVar10);
        if (iVar12 == 0) {
          return;
        }
        if ((byte)uVar17 < 0x32) {
          return;
        }
        if ((this->super_BrokerBase).field_0x294 == '\0') {
          ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_priority_disconnect);
          local_e8._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
          (*(this->super_Broker)._vptr_Broker[0x22])(this,0,(ActionMessage *)local_e8);
          ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        }
        ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_stop);
        BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
      }
LAB_002f1d23:
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      return;
    }
    if (aVar3 == cmd_send_command) {
      processCommandInstruction(this,command);
      return;
    }
    if (aVar3 != cmd_broker_query) {
      if (aVar3 != cmd_broker_ack) {
        return;
      }
      __n = (pointer)(command->payload).bufferSize;
      __s1 = (command->payload).heap;
      pcVar7 = (pointer)(this->super_BrokerBase).identifier._M_string_length;
      if ((__n != pcVar7) ||
         ((pcVar5 = (this->super_BrokerBase).identifier._M_dataplus._M_p, __n != (pointer)0x0 &&
          (iVar12 = bcmp(__s1,pcVar5,(size_t)__n), iVar12 != 0)))) {
        this_01 = &this->mBrokers;
        local_e8._0_8_ = __n;
        local_e8._8_8_ = __s1;
        iVar14 = std::
                 _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&(this->mBrokers).lookup1,(key_type *)local_e8);
        if (iVar14.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          pBVar16 = (this->mBrokers).dataStorage.
                    super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          pBVar16 = (this_01->dataStorage).
                    super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    *(long *)((long)iVar14.
                                    super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                    ._M_cur + 0x18);
        }
        if (pBVar16 !=
            (this->mBrokers).dataStorage.
            super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          iVar12 = (command->dest_id).gid;
          if ((pBVar16->global_id).gid == iVar12) {
            local_138 = 0x14;
            pcStack_130 = "repeated broker acks";
            message_00._M_str = "repeated broker acks";
            message_00._M_len = 0x14;
            name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
            name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
            BrokerBase::sendToLogger
                      (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid
                       ,3,name_00,message_00,false);
            return;
          }
          (pBVar16->global_id).gid = iVar12;
          local_e8._0_4_ = (pBVar16->route).rid;
          local_168._M_dataplus._M_p._0_4_ = (command->dest_id).gid;
          existingValue_00._M_str = (pBVar16->name)._M_dataplus._M_p;
          existingValue_00._M_len = (pBVar16->name)._M_string_length;
          gmlc::containers::
          DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
          ::addSearchTerm(this_01,(GlobalBrokerId *)&local_168,existingValue_00);
          std::
          _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<helics::GlobalBrokerId&,helics::route_id&>
                    ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->routing_table,&pBVar16->global_id,local_e8);
          (command->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
          (*(this->super_Broker)._vptr_Broker[0x22])(this,local_e8._0_8_ & 0xffffffff,command);
          return;
        }
        local_e8._0_8_ = (command->payload).bufferSize;
        local_e8._8_8_ = (command->payload).heap;
        local_168._M_dataplus._M_p._0_4_ = (command->dest_id).gid;
        searchValue1_00._M_str = (char *)local_e8._8_8_;
        searchValue1_00._M_len = local_e8._0_8_;
        gmlc::containers::
        DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
        ::insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((DualStringMappedVector<helics::BasicBrokerInfo,helics::GlobalBrokerId,(reference_stability)1,5>
                    *)this_01,searchValue1_00,(GlobalBrokerId *)&local_168,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_e8);
        rVar13 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
        pBVar10 = (this->mBrokers).dataStorage.
                  super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar10[-1].route.rid = rVar13.rid;
        pBVar10[-1].global_id.gid = (command->dest_id).gid;
        std::
        _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<helics::GlobalBrokerId&,helics::route_id&>
                  ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->routing_table,&pBVar16->global_id,&pBVar10[-1].route);
        return;
      }
      if ((command->flags & 0x10) != 0) {
        GVar2.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        local_168._M_string_length = (command->payload).bufferSize;
        local_168._M_dataplus._M_p = (pointer)(command->payload).heap;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x1c;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_168;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_e8,(v11 *)"unable to register broker {}",fmt_00,args_00);
        local_128 = (byte *)local_e8._8_8_;
        paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._0_8_;
        message_01._M_str = (char *)local_e8._0_8_;
        message_01._M_len = local_e8._8_8_;
        name_01._M_str = pcVar5;
        name_01._M_len = (size_t)pcVar7;
        BrokerBase::sendToLogger(this_00,GVar2,0,name_01,message_01,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._0_8_ == local_d8) {
          return;
        }
        operator_delete((void *)local_e8._0_8_,
                        CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_d8[0]._M_allocated_capacity) + 1);
        return;
      }
      BVar4 = (command->dest_id).gid;
      (this->super_BrokerBase).global_broker_id_local.gid = BVar4;
      LOCK();
      (this->super_BrokerBase).global_id._M_i.gid = BVar4;
      UNLOCK();
      (this->super_BrokerBase).higher_broker_id.gid = (command->source_id).gid;
      uVar1 = command->flags;
      if (((uVar1 & 0x20) != 0) && ((this->super_BrokerBase).globalTime = true, (char)uVar1 < '\0'))
      {
        (this->super_BrokerBase).asyncTime = true;
      }
      (((this->super_BrokerBase).timeCoord._M_t.
        super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
        .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->mSourceId).gid =
           (this->super_BrokerBase).global_broker_id_local.gid;
      transmitDelayedMessages(this);
      pBVar16 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar10 = (this->mBrokers).dataStorage.
                super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pBVar16 != pBVar10) {
        BVar4 = (this->super_BrokerBase).global_broker_id_local.gid;
        do {
          if (pBVar16->_nonLocal == false) {
            (pBVar16->parent).gid = BVar4;
          }
          pBVar16 = pBVar16 + 1;
        } while (pBVar16 != pBVar10);
      }
      this_03 = (this->timeoutMon)._M_t.
                super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
                .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl;
      (this_03->parentConnection).connection.gid = (this->super_BrokerBase).higher_broker_id.gid;
      if ((command->flags & 0x4000) != 0) {
        (this_03->parentConnection).disablePing = true;
        (this_03->parentConnection).waitingForPingReply = false;
      }
      TimeoutMonitor::reset(this_03);
      if ((command->flags & 0x800) == 0) {
        return;
      }
      (this->super_BrokerBase).globalDisconnect = true;
      return;
    }
  }
  processQueryCommand(this,command);
  return;
}

Assistant:

void CoreBroker::processPriorityCommand(ActionMessage&& command)
{
    // deal with a few types of message immediately
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| priority_cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_PING_PRIORITY:
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            } else {
                routeMessage(command);
            }
            break;
        case CMD_BROKER_SETUP: {
            global_broker_id_local = global_id.load();
            isRootc = _isRoot.load();
            timeCoord->setSourceId(global_broker_id_local);
            connectionEstablished = true;
            if (!earlyMessages.empty()) {
                for (auto& message : earlyMessages) {
                    if (isPriorityCommand(message)) {
                        processPriorityCommand(std::move(message));
                    } else {
                        processCommand(std::move(message));
                    }
                }
                earlyMessages.clear();
            }
            break;
        }
        case CMD_REG_FED:
            fedRegistration(std::move(command));
            break;
        case CMD_REG_BROKER:
            brokerRegistration(std::move(command));
            break;
        case CMD_FED_ACK: {  // we can't be root if we got one of these
            auto fed = mFederates.find(command.name());
            if (fed != mFederates.end()) {
                auto route = fed->route;
                if (!fed->global_id.isValid()) {
                    fed->global_id = command.dest_id;
                    mFederates.addSearchTerm(command.dest_id, fed->name);
                }
                transmit(route, command);
                routing_table.emplace(fed->global_id, route);
                if (enable_profiling) {
                    ActionMessage fedEnableProfiling(CMD_SET_PROFILER_FLAG,
                                                     global_broker_id_local,
                                                     command.dest_id);
                    setActionFlag(fedEnableProfiling, indicator_flag);
                    transmit(route, fedEnableProfiling);
                }
            } else {
                // this means we haven't seen this federate before for some reason
                mFederates.insert(command.name(), command.dest_id, command.name());
                mFederates.back().route = getRoute(command.source_id);
                mFederates.back().global_id = command.dest_id;
                routing_table.emplace(fed->global_id, mFederates.back().route);
                // it also means we don't forward it
            }

        } break;
        case CMD_BROKER_ACK: {  // we can't be root if we got one of these
            if (command.name() == identifier) {
                if (checkActionFlag(command, error_flag)) {
                    // generate an error message
                    LOG_ERROR(global_broker_id_local,
                              identifier,
                              fmt::format("unable to register broker {}",
                                          command.payload.to_string()));
                    return;
                }

                global_broker_id_local = command.dest_id;
                global_id.store(global_broker_id_local);
                higher_broker_id = command.source_id;
                if (checkActionFlag(command, global_timing_flag)) {
                    globalTime = true;
                    if (checkActionFlag(command, async_timing_flag)) {
                        asyncTime = true;
                    }
                }
                timeCoord->setSourceId(global_broker_id_local);
                transmitDelayedMessages();
                mBrokers.apply([localid = global_broker_id_local](auto& brk) {
                    if (!brk._nonLocal) {
                        brk.parent = localid;
                    }
                });

                timeoutMon->setParentId(higher_broker_id);
                if (checkActionFlag(command, slow_responding_flag)) {
                    timeoutMon->disableParentPing();
                }
                timeoutMon->reset();
                if (checkActionFlag(command, global_disconnect_flag)) {
                    globalDisconnect = true;
                }
                return;
            }
            auto broker = mBrokers.find(command.name());
            if (broker != mBrokers.end()) {
                if (broker->global_id == GlobalBrokerId{command.dest_id}) {
                    // drop the packet since we have seen this ack already
                    LOG_WARNING(global_broker_id_local, identifier, "repeated broker acks");
                    return;
                }
                broker->global_id = GlobalBrokerId{command.dest_id};
                auto route = broker->route;
                mBrokers.addSearchTerm(GlobalBrokerId{command.dest_id}, broker->name);
                routing_table.emplace(broker->global_id, route);
                command.source_id = global_broker_id_local;  // we want the intermediate broker to
                                                             // change the source_id
                transmit(route, command);
            } else {
                mBrokers.insert(command.name(), GlobalBrokerId{command.dest_id}, command.name());
                mBrokers.back().route = getRoute(command.source_id);
                mBrokers.back().global_id = GlobalBrokerId{command.dest_id};
                routing_table.emplace(broker->global_id, mBrokers.back().route);
            }
        } break;
        case CMD_PRIORITY_DISCONNECT: {
            auto* brk = getBrokerById(GlobalBrokerId{command.source_id});
            if (brk != nullptr) {
                brk->state = ConnectionState::DISCONNECTED;
            }
            if (getAllConnectionState() >= ConnectionState::DISCONNECTED) {
                if (!isRootc) {
                    ActionMessage dis(CMD_PRIORITY_DISCONNECT);
                    dis.source_id = global_broker_id_local;
                    transmit(parent_route_id, dis);
                }
                addActionMessage(CMD_STOP);
            }
        } break;
        case CMD_REG_ROUTE:
            break;
        case CMD_SEND_COMMAND:
            processCommandInstruction(command);
            break;
        case CMD_BROKER_QUERY:
        case CMD_QUERY:
        case CMD_QUERY_REPLY:
        case CMD_SET_GLOBAL:
            processQueryCommand(command);
            break;

        default:
            // must not have been a priority command
            break;
    }
}